

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out_of_source_main.cpp
# Opt level: O1

string * getApprovedFilesLocation_abi_cxx11_(void)

{
  bool bVar1;
  char *in_RDX;
  string *in_RDI;
  string locationFromEnvVar;
  string local_38;
  
  ApprovalTests::SystemUtils::safeGetEnv_abi_cxx11_
            (&local_38,(SystemUtils *)"APPROVED_FILES_ROOT_DIR",in_RDX);
  if (local_38._M_string_length == 0) {
    bVar1 = isRunningInBuildEnvironment();
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    if (bVar1) {
      std::__cxx11::string::_M_construct<char_const*>();
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>();
    }
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char*>();
    std::__cxx11::string::append((char *)in_RDI);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return in_RDI;
}

Assistant:

std::string getApprovedFilesLocation()
{
    std::string locationFromEnvVar = SystemUtils::safeGetEnv("APPROVED_FILES_ROOT_DIR");
    if (!locationFromEnvVar.empty())
    {
        return locationFromEnvVar + "/{RelativeTestSourceDirectory}/";
    }

    if (isRunningInBuildEnvironment())
    {
        return "{TestSourceDirectory}/";
    }

    return "./{RelativeTestSourceDirectory}/"; // Use current working directory
}